

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

IdList * sqlite3IdListAppend(sqlite3 *db,IdList *pList,Token *pToken)

{
  IdList_item *pIVar1;
  char *pcVar2;
  sqlite3 *in_RDX;
  IdList *in_RSI;
  int i;
  int *unaff_retaddr;
  undefined4 in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  IdList *local_18;
  int *in_stack_fffffffffffffff8;
  
  local_18 = in_RSI;
  if ((in_RSI == (IdList *)0x0) &&
     (local_18 = (IdList *)
                 sqlite3DbMallocZero(in_RDX,CONCAT44(in_stack_ffffffffffffffdc,
                                                     in_stack_ffffffffffffffd8)),
     local_18 == (IdList *)0x0)) {
    local_18 = (IdList *)0x0;
  }
  else {
    pIVar1 = (IdList_item *)
             sqlite3ArrayAllocate(db,pList,pToken._4_4_,unaff_retaddr,in_stack_fffffffffffffff8);
    local_18->a = pIVar1;
    if (in_stack_ffffffffffffffdc < 0) {
      sqlite3IdListDelete(in_RDX,(IdList *)
                                 CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
      local_18 = (IdList *)0x0;
    }
    else {
      pcVar2 = sqlite3NameFromToken
                         (in_RDX,(Token *)CONCAT44(in_stack_ffffffffffffffdc,
                                                   in_stack_ffffffffffffffd8));
      local_18->a[in_stack_ffffffffffffffdc].zName = pcVar2;
    }
  }
  return local_18;
}

Assistant:

SQLITE_PRIVATE IdList *sqlite3IdListAppend(sqlite3 *db, IdList *pList, Token *pToken){
  int i;
  if( pList==0 ){
    pList = sqlite3DbMallocZero(db, sizeof(IdList) );
    if( pList==0 ) return 0;
  }
  pList->a = sqlite3ArrayAllocate(
      db,
      pList->a,
      sizeof(pList->a[0]),
      &pList->nId,
      &i
  );
  if( i<0 ){
    sqlite3IdListDelete(db, pList);
    return 0;
  }
  pList->a[i].zName = sqlite3NameFromToken(db, pToken);
  return pList;
}